

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::CodeHolder::newRelocEntry(CodeHolder *this,RelocEntry **dst,RelocType relocType)

{
  uint32_t uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  Error EVar5;
  RelocEntry *pRVar6;
  long lVar7;
  ulong uVar8;
  ZoneAllocator *allocator;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  size_t local_30;
  
  allocator = &this->_allocator;
  EVar5 = 0;
  if (*(int *)&this->field_0x114 == *(int *)&this->field_0x110) {
    EVar5 = ZoneVectorBase::_grow((ZoneVectorBase *)&this->_relocations,allocator,8,1);
  }
  if (EVar5 == 0) {
    uVar1 = *(uint32_t *)&this->field_0x110;
    if (uVar1 == 0xffffffff) {
      EVar5 = 0x16;
    }
    else {
      if (*(long *)allocator == 0) {
        newRelocEntry();
      }
      else {
        pRVar6 = (RelocEntry *)ZoneAllocator::_allocZeroed(allocator,0x28,&local_30);
        if (pRVar6 != (RelocEntry *)0x0) {
          pRVar6->_id = uVar1;
          pRVar6->_relocType = relocType;
          pRVar6->_sourceSectionId = 0xffffffff;
          pRVar6->_targetSectionId = 0xffffffff;
          if (*(uint *)&this->field_0x110 < *(uint *)&this->field_0x114) {
            *(RelocEntry **)(*(long *)&this->_relocations + (ulong)*(uint *)&this->field_0x110 * 8)
                 = pRVar6;
            *(int *)&this->field_0x110 = *(int *)&this->field_0x110 + 1;
            *dst = pRVar6;
            return 0;
          }
          newRelocEntry();
          lVar2 = *(long *)(allocator + 0xe8);
          uVar8 = (ulong)*(uint *)(allocator + 0xf0);
          bVar13 = uVar8 == 0;
          if (!bVar13) {
            lVar9 = 0;
            uVar12 = 0;
            do {
              lVar7 = *(long *)(lVar2 + lVar9);
              uVar10 = *(ulong *)(lVar7 + 0x50);
              if (*(ulong *)(lVar7 + 0x50) < *(ulong *)(lVar7 + 0x18)) {
                uVar10 = *(ulong *)(lVar7 + 0x18);
              }
              if (uVar10 == 0) {
                bVar4 = true;
              }
              else {
                uVar11 = -(ulong)*(uint *)(lVar7 + 8) & (uVar12 + *(uint *)(lVar7 + 8)) - 1;
                if (uVar11 < uVar12) {
                  bVar4 = false;
                }
                else {
                  uVar12 = uVar11 + uVar10;
                  bVar4 = !CARRY8(uVar11,uVar10);
                }
              }
              if (!bVar4) break;
              lVar9 = lVar9 + 8;
              bVar13 = uVar8 * 8 - lVar9 == 0;
            } while (!bVar13);
          }
          EVar5 = 9;
          if (bVar13) {
            if (uVar8 != 0) {
              lVar7 = 0;
              uVar12 = 0;
              lVar9 = 0;
              do {
                lVar3 = *(long *)(lVar2 + lVar7);
                uVar10 = *(ulong *)(lVar3 + 0x50);
                if (*(ulong *)(lVar3 + 0x50) < *(ulong *)(lVar3 + 0x18)) {
                  uVar10 = *(ulong *)(lVar3 + 0x18);
                }
                if (uVar10 != 0) {
                  uVar12 = -(ulong)*(uint *)(lVar3 + 8) & (uVar12 + *(uint *)(lVar3 + 8)) - 1;
                }
                *(ulong *)(lVar3 + 0x10) = uVar12;
                if (lVar9 != 0) {
                  *(ulong *)(lVar9 + 0x18) = uVar12 - *(long *)(lVar9 + 0x10);
                }
                uVar12 = uVar12 + uVar10;
                lVar7 = lVar7 + 8;
                lVar9 = lVar3;
              } while (uVar8 << 3 != lVar7);
            }
            EVar5 = 0;
          }
          return EVar5;
        }
      }
      EVar5 = 1;
    }
  }
  return EVar5;
}

Assistant:

Error CodeHolder::newRelocEntry(RelocEntry** dst, RelocType relocType) noexcept {
  ASMJIT_PROPAGATE(_relocations.willGrow(&_allocator));

  uint32_t relocId = _relocations.size();
  if (ASMJIT_UNLIKELY(relocId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyRelocations);

  RelocEntry* re = _allocator.allocZeroedT<RelocEntry>();
  if (ASMJIT_UNLIKELY(!re))
    return DebugUtils::errored(kErrorOutOfMemory);

  re->_id = relocId;
  re->_relocType = relocType;
  re->_sourceSectionId = Globals::kInvalidId;
  re->_targetSectionId = Globals::kInvalidId;
  _relocations.appendUnsafe(re);

  *dst = re;
  return kErrorOk;
}